

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memrev.c
# Opt level: O2

int mpt_memswap(void *from,void *to,size_t len)

{
  void *__src;
  void *__src_00;
  ulong uVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  char buf [1024];
  
  if (to == (void *)0x0 || from == (void *)0x0) {
    iVar2 = -1;
  }
  else {
    uVar1 = len >> 10;
    lVar3 = 0;
    while( true ) {
      __src = (void *)((long)from + lVar3);
      __src_00 = (void *)((long)to + lVar3);
      bVar4 = uVar1 == 0;
      uVar1 = uVar1 - 1;
      if (bVar4) break;
      memcpy(buf,__src,0x400);
      memcpy(__src,__src_00,0x400);
      memcpy(__src_00,buf,0x400);
      lVar3 = lVar3 + 0x400;
    }
    iVar2 = 0;
    uVar1 = len & 0x3ff;
    if (uVar1 != 0) {
      memcpy(buf,__src,uVar1);
      memcpy(__src,__src_00,uVar1);
      memcpy(__src_00,buf,uVar1);
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_memswap(void *from, void *to, size_t len)
{
	char buf[1024];
	size_t parts, i;
	
	if (!from || !to) {
		return MPT_ERROR(BadArgument);
	}
	
	parts = len / sizeof(buf);
	len   = len % sizeof(buf);
	
	for ( i = 0 ; i < parts ; i++ ) {
		(void) memcpy(buf, from, sizeof(buf));
		(void) memcpy(from, to, sizeof(buf));
		(void) memcpy(to, buf, sizeof(buf));
		
		from = ((char *) from) + sizeof(buf);
		to   = ((char *) to)   + sizeof(buf);
	}
	if ( len ) {
		(void) memcpy(buf, from, len);
		(void) memcpy(from, to, len);
		(void) memcpy(to, buf, len);
	}
	return 0;
}